

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_murder(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CHAR_DATA *pCVar4;
  char *pcVar5;
  CHAR_DATA *in_RDI;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  char arg [4608];
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffdb38;
  CHAR_DATA *in_stack_ffffffffffffdb40;
  CHAR_DATA *in_stack_ffffffffffffdb48;
  CHAR_DATA *in_stack_ffffffffffffdb50;
  undefined8 in_stack_ffffffffffffdb68;
  CHAR_DATA *in_stack_ffffffffffffdb70;
  CHAR_DATA *in_stack_ffffffffffffdba0;
  CHAR_DATA *in_stack_ffffffffffffdba8;
  char local_2418;
  int in_stack_ffffffffffffdc3c;
  CHAR_DATA *in_stack_ffffffffffffdc40;
  int in_stack_ffffffffffffed38;
  int in_stack_ffffffffffffed3c;
  CHAR_DATA *in_stack_ffffffffffffed40;
  CHAR_DATA *in_stack_ffffffffffffed48;
  CHAR_DATA local_1218 [5];
  CHAR_DATA *local_8;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffdb68 >> 0x20);
  local_8 = in_RDI;
  one_argument((char *)in_stack_ffffffffffffdb40,(char *)in_stack_ffffffffffffdb38);
  if (local_2418 == '\0') {
    send_to_char((char *)in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
  }
  else {
    bVar1 = is_affected_by(in_stack_ffffffffffffdb48,(int)((ulong)in_stack_ffffffffffffdb40 >> 0x20)
                          );
    if ((!bVar1) && (bVar1 = is_npc(in_stack_ffffffffffffdb38), bVar1)) {
      in_stack_ffffffffffffdb70 = (CHAR_DATA *)local_8->act[0];
      std::pow<int,int>(0,0x5e827e);
    }
    pCVar4 = get_char_room(in_stack_ffffffffffffed48,(char *)in_stack_ffffffffffffed40);
    if (pCVar4 == (CHAR_DATA *)0x0) {
      send_to_char((char *)in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
    }
    else if (pCVar4 == local_8) {
      send_to_char((char *)in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
    }
    else {
      bVar1 = is_safe(in_stack_ffffffffffffdb40,in_stack_ffffffffffffdb38);
      if (((!bVar1) &&
          (bVar1 = check_shroud_of_light(in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0),
          !bVar1)) &&
         (bVar1 = check_sidestep(in_stack_ffffffffffffed48,in_stack_ffffffffffffed40,
                                 in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38), !bVar1)) {
        bVar1 = is_affected_by(in_stack_ffffffffffffdb48,
                               (int)((ulong)in_stack_ffffffffffffdb40 >> 0x20));
        if ((bVar1) && (local_8->master == pCVar4)) {
          act((char *)in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48,in_stack_ffffffffffffdb40,
              in_stack_ffffffffffffdb38,0);
        }
        else if (local_8->position == 7) {
          send_to_char((char *)in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
        }
        else {
          bVar1 = is_affected(local_8,(int)gsn_rage);
          if (((bVar1) && (bVar1 = is_npc(in_stack_ffffffffffffdb38), !bVar1)) &&
             (local_8->pcdata->tribe == 8)) {
            act((char *)in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48,
                in_stack_ffffffffffffdb40,in_stack_ffffffffffffdb38,0);
            act((char *)in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48,
                in_stack_ffffffffffffdb40,in_stack_ffffffffffffdb38,0);
            act((char *)in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48,
                in_stack_ffffffffffffdb40,in_stack_ffffffffffffdb38,0);
            iVar2 = number_percent();
            if (((0x19 < iVar2) &&
                (iVar2 = get_curr_stat(in_stack_ffffffffffffdb70,iVar3), 0xd < iVar2)) &&
               (iVar3 = get_curr_stat(in_stack_ffffffffffffdb70,iVar3), 9 < iVar3)) {
              act((char *)in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48,
                  in_stack_ffffffffffffdb40,in_stack_ffffffffffffdb38,0);
              init_affect((AFFECT_DATA *)0x5e851e);
              skill_lookup((char *)in_stack_ffffffffffffdb48);
              affect_to_char(in_stack_ffffffffffffdb40,(AFFECT_DATA *)in_stack_ffffffffffffdb38);
              affect_to_char(in_stack_ffffffffffffdb40,(AFFECT_DATA *)in_stack_ffffffffffffdb38);
            }
          }
          WAIT_STATE(in_stack_ffffffffffffdb50,(int)((ulong)in_stack_ffffffffffffdb48 >> 0x20));
          un_blade_barrier(in_stack_ffffffffffffdb40,(char *)in_stack_ffffffffffffdb38);
          bVar1 = is_npc(in_stack_ffffffffffffdb38);
          if ((bVar1) &&
             (bVar1 = is_affected_by(in_stack_ffffffffffffdb48,
                                     (int)((ulong)in_stack_ffffffffffffdb40 >> 0x20)), bVar1)) {
            sprintf((char *)local_1218,"Help!  I am being attacked by %s!",local_8->short_descr);
          }
          else {
            bVar1 = is_npc(in_stack_ffffffffffffdb38);
            if ((!bVar1) || (bVar1 = is_npc(in_stack_ffffffffffffdb38), bVar1)) {
              bVar1 = is_npc(in_stack_ffffffffffffdb38);
              if (!bVar1) {
                iVar3 = number_range((int)in_stack_ffffffffffffdb40,
                                     (int)((ulong)in_stack_ffffffffffffdb38 >> 0x20));
                switch(iVar3) {
                case 1:
                  pcVar5 = pers(in_stack_ffffffffffffdb48,in_stack_ffffffffffffdb40);
                  sprintf((char *)local_1218,"Help!  I am being attacked by %s!",pcVar5);
                  break;
                case 2:
                  in_stack_ffffffffffffdb50 = local_1218;
                  pcVar5 = pers(in_stack_ffffffffffffdb48,in_stack_ffffffffffffdb40);
                  sprintf((char *)in_stack_ffffffffffffdb50,"Die, %s, you treacherous fool!",pcVar5)
                  ;
                  break;
                case 3:
                  in_stack_ffffffffffffdb48 = local_1218;
                  pcVar5 = pers(in_stack_ffffffffffffdb48,in_stack_ffffffffffffdb40);
                  sprintf((char *)in_stack_ffffffffffffdb48,"Help!  %s is attacking me!",pcVar5);
                  break;
                case 4:
                  in_stack_ffffffffffffdb40 = local_1218;
                  pcVar5 = pers(in_stack_ffffffffffffdb48,in_stack_ffffffffffffdb40);
                  sprintf((char *)in_stack_ffffffffffffdb40,"Die, %s, you foul dog!",pcVar5);
                  break;
                default:
                  in_stack_ffffffffffffdb38 = local_1218;
                  pcVar5 = pers(in_stack_ffffffffffffdb48,in_stack_ffffffffffffdb40);
                  sprintf((char *)in_stack_ffffffffffffdb38,"Help!  I am being attacked by %s!",
                          pcVar5);
                }
              }
            }
            else {
              pCVar4 = local_1218;
              pcVar5 = pers(in_stack_ffffffffffffdb48,in_stack_ffffffffffffdb40);
              sprintf((char *)pCVar4,"Help!  I am being attacked by %s!",pcVar5);
            }
          }
          bVar1 = is_npc(in_stack_ffffffffffffdb38);
          if (!bVar1) {
            do_myell(in_stack_ffffffffffffdb50,(char *)in_stack_ffffffffffffdb48,
                     in_stack_ffffffffffffdb40);
          }
          check_blade_barrier(in_stack_ffffffffffffdb48,in_stack_ffffffffffffdb40);
          iVar2 = (int)((ulong)in_stack_ffffffffffffdb40 >> 0x20);
          one_hit(in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48,iVar2);
          iVar3 = get_skill(in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc3c);
          if ((iVar3 != 0) && (iVar3 = number_percent(), 0x32 < iVar3)) {
            one_hit(in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48,iVar2);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void do_murder(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	AFFECT_DATA af;
	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Murder whom?\n\r", ch);
		return;
	}

	if ((is_affected_by(ch, AFF_CHARM) || (is_npc(ch) && IS_SET(ch->act, ACT_PET))))
	{
		//        return;
	}

	victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("Suicide is a mortal sin.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim))
		return;

	if (check_shroud_of_light(ch, victim))
		return;

	if (check_sidestep(ch, victim, 0, 50))
		return;

	if (is_affected_by(ch, AFF_CHARM) && ch->master == victim)
	{
		act("$N is your beloved master.", ch, nullptr, victim, TO_CHAR);
		return;
	}

	if (ch->position == POS_FIGHTING)
	{
		send_to_char("You do the best you can!\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_rage) && !is_npc(ch) && ch->pcdata->tribe == TRIBE_FOX)
	{
		act("Charging towards $N, with the cunning of the Fox, you circle around and strike at $S exposed flank!", ch, 0, victim, TO_CHAR);
		act("Charging towards you, $n abruptly circles around and strikes at your exposed flank!", ch, 0, victim, TO_VICT);
		act("Charging towards $N, $n abruptly circles around and strikes at $S exposed flank!", ch, 0, victim, TO_NOTVICT);

		if (number_percent() > 25 && get_curr_stat(victim, STAT_STR) > 13 && get_curr_stat(victim, STAT_DEX) > 9)
		{
			act("A chilling tearing sound heralds the destruction of flesh and bone.", ch, 0, 0, TO_ALL);

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.type = skill_lookup("torn muscles");
			af.aftype = AFT_MALADY;
			af.duration = ch->level / 20;
			af.level = ch->level;
			af.location = APPLY_STR;
			af.modifier = -2;
			affect_to_char(victim, &af);

			af.location = APPLY_DEX;
			affect_to_char(victim, &af);
		}
	}

	WAIT_STATE(ch, 1 * PULSE_VIOLENCE);

	un_blade_barrier(ch, nullptr);

	if (is_npc(victim) && is_affected_by(victim, AFF_CHARM))
	{
		sprintf(buf, "Help!  I am being attacked by %s!", ch->short_descr);
	}
	else if (is_npc(ch) && !is_npc(victim))
	{
		sprintf(buf, "Help!  I am being attacked by %s!", pers(ch, victim));
	}
	else if (!is_npc(victim))
	{
		switch (number_range(1, 4))
		{
			case 1:
				sprintf(buf, "Help!  I am being attacked by %s!", pers(ch, victim));
				break;
			case 2:
				sprintf(buf, "Die, %s, you treacherous fool!", pers(ch, victim));
				break;
			case 3:
				sprintf(buf, "Help!  %s is attacking me!", pers(ch, victim));
				break;
			case 4:
				sprintf(buf, "Die, %s, you foul dog!", pers(ch, victim));
				break;
			default:
				sprintf(buf, "Help!  I am being attacked by %s!", pers(ch, victim));
				break;
		}
	}

	/* Added a myell hack of yell so Enforcer cabal members can see if a PK
	yell is faked or not (see myell in act_comm.c for this).
	-Ceran
	*/
	if (!is_npc(victim))
		do_myell(victim, buf, ch);

	check_blade_barrier(ch, victim);
	one_hit(ch, victim, TYPE_UNDEFINED);

	if (get_skill(ch, gsn_third_attack) && number_percent() > 50)
		one_hit(ch, victim, TYPE_UNDEFINED);
}